

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyPoint2Point.cpp
# Opt level: O2

int __thiscall btMultiBodyPoint2Point::getIslandIdA(btMultiBodyPoint2Point *this)

{
  uint uVar1;
  btMultiBody *pbVar2;
  ulong uVar3;
  ulong uVar4;
  btRigidBody *pbVar5;
  
  pbVar5 = this->m_rigidBodyA;
  if (pbVar5 == (btRigidBody *)0x0) {
    pbVar2 = (this->super_btMultiBodyConstraint).m_bodyA;
    if (pbVar2 == (btMultiBody *)0x0) {
      return -1;
    }
    pbVar5 = (btRigidBody *)pbVar2->m_baseCollider;
    if (pbVar5 == (btRigidBody *)0x0) {
      uVar1 = (pbVar2->m_links).m_size;
      uVar4 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = 0;
      }
      uVar3 = 0;
      do {
        if (uVar4 * 600 + 600 == uVar3 + 600) {
          return -1;
        }
        pbVar5 = *(btRigidBody **)((long)((pbVar2->m_links).m_data)->m_jointTorque + uVar3 + 0x1c);
        uVar3 = uVar3 + 600;
      } while (pbVar5 == (btRigidBody *)0x0);
    }
  }
  return (pbVar5->super_btCollisionObject).m_islandTag1;
}

Assistant:

int btMultiBodyPoint2Point::getIslandIdA() const
{
	if (m_rigidBodyA)
		return m_rigidBodyA->getIslandTag();

	if (m_bodyA)
	{
		btMultiBodyLinkCollider* col = m_bodyA->getBaseCollider();
		if (col)
			return col->getIslandTag();
		for (int i=0;i<m_bodyA->getNumLinks();i++)
		{
			if (m_bodyA->getLink(i).m_collider)
				return m_bodyA->getLink(i).m_collider->getIslandTag();
		}
	}
	return -1;
}